

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::processLoggingMessage(FederateState *this,ActionMessage *cmd)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view data;
  string_view data_00;
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  SmallBuffer *in_RDI;
  bool in_stack_00000053;
  int in_stack_00000054;
  FederateState *in_stack_00000058;
  undefined1 in_stack_00000060 [16];
  string qres;
  FederateState *in_stack_00000b68;
  string_view in_stack_00000b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ActionMessage *in_stack_fffffffffffffeb8;
  FederateState *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  int __val;
  undefined1 in_stack_fffffffffffffee8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string_view local_c8;
  __sv_type local_b8;
  __sv_type local_78;
  string_view local_48;
  char *local_38;
  string_view local_30;
  __sv_type local_20;
  ActionMessage *local_10;
  
  __val = in_stack_fffffffffffffee8._4_4_;
  local_10 = in_RSI;
  aVar2 = ActionMessage::action(in_RSI);
  if (aVar2 != cmd_log) {
    if (aVar2 == cmd_set_profiler_flag) {
      checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_10,indicator_flag);
      setOptionFlag(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x18,0));
      return;
    }
    if (aVar2 == cmd_timeout_disconnect) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,
                 (char *)in_stack_fffffffffffffeb8);
      this_00 = &local_e8;
      processQueryActual_abi_cxx11_(in_stack_00000b68,in_stack_00000b70);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
      std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
      std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
      logMessage(in_stack_00000058,in_stack_00000054,(string_view)qres._0_16_,
                 (string_view)in_stack_00000060,in_stack_00000053);
      std::__cxx11::string::~string(this_00);
      return;
    }
    if (aVar2 != cmd_remote_log) {
      if (aVar2 != cmd_warning) {
        return;
      }
      bVar1 = SmallBuffer::empty(&local_10->payload);
      if (bVar1) {
        local_38 = commandErrorString((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        SmallBuffer::operator=
                  (in_RDI,(char **)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        local_48 = SmallBuffer::to_string((SmallBuffer *)0x59324a);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,
                   (char *)in_stack_fffffffffffffeb8);
        __x._M_str._0_4_ = in_stack_fffffffffffffee0;
        __x._M_len = (size_t)in_RDI;
        __x._M_str._4_4_ = aVar2;
        __y._M_str._0_4_ = in_stack_fffffffffffffed0;
        __y._M_len = in_stack_fffffffffffffec8;
        __y._M_str._4_4_ = in_stack_fffffffffffffed4;
        bVar1 = std::operator==(__x,__y);
        if (bVar1) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,
                     (char *)&local_10->payload);
          data._M_str._0_4_ = in_stack_fffffffffffffee0;
          data._M_len = (size_t)in_RDI;
          data._M_str._4_4_ = aVar2;
          SmallBuffer::append((SmallBuffer *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),data);
          CLI::std::__cxx11::to_string(__val);
          local_78 = std::__cxx11::string::operator_cast_to_basic_string_view
                               (in_stack_fffffffffffffeb0);
          data_00._M_str._0_4_ = in_stack_fffffffffffffee0;
          data_00._M_len = (size_t)in_RDI;
          data_00._M_str._4_4_ = aVar2;
          SmallBuffer::append((SmallBuffer *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),data_00)
          ;
          std::__cxx11::string::~string(in_stack_fffffffffffffeb0);
        }
      }
      local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb0)
      ;
      local_c8 = SmallBuffer::to_string((SmallBuffer *)0x59339e);
      logMessage(in_stack_00000058,in_stack_00000054,(string_view)qres._0_16_,
                 (string_view)in_stack_00000060,in_stack_00000053);
      return;
    }
  }
  ActionMessage::getString_abi_cxx11_
            (in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_20 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb0);
  local_30 = SmallBuffer::to_string((SmallBuffer *)0x593188);
  ActionMessage::action(local_10);
  logMessage(in_stack_00000058,in_stack_00000054,(string_view)qres._0_16_,
             (string_view)in_stack_00000060,in_stack_00000053);
  return;
}

Assistant:

void FederateState::processLoggingMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_LOG:
        case CMD_REMOTE_LOG:
            logMessage(cmd.messageID,
                       cmd.getString(0),
                       cmd.payload.to_string(),
                       cmd.action() == CMD_REMOTE_LOG);
            break;

        case CMD_WARNING:
            if (cmd.payload.empty()) {
                cmd.payload = commandErrorString(cmd.messageID);
                if (cmd.payload.to_string() == "unknown") {
                    cmd.payload.append(" code:");
                    cmd.payload.append(std::to_string(cmd.messageID));
                }
            }
            LOG_WARNING(cmd.payload.to_string());
            break;
        case CMD_SET_PROFILER_FLAG:
            setOptionFlag(defs::PROFILING, checkActionFlag(cmd, indicator_flag));
            break;
        case CMD_TIMEOUT_DISCONNECT: {
            auto qres = processQueryActual("global_time_debugging");
            qres.insert(0, "TIME DEBUGGING::");
            LOG_WARNING(qres);
        } break;
        default:
            break;
    }
}